

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O2

void * duckdb_je_b0_alloc_tcache_stack(tsdn_t *tsdn,size_t stack_size)

{
  ulong uVar1;
  edata_avail_t *ph;
  long lVar2;
  base_t *base;
  edata_t *phn;
  undefined8 *puVar3;
  ulong uVar4;
  size_t size;
  size_t esn;
  
  base = b0;
  malloc_mutex_lock(tsdn,&b0->mtx);
  ph = &base->edata_avail;
  phn = duckdb_je_edata_avail_first(ph);
  if (phn == (edata_t *)0x0) {
    (base->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48));
    phn = duckdb_je_base_alloc_edata(tsdn,base);
    if (phn == (edata_t *)0x0) {
      return (void *)0x0;
    }
  }
  else {
    duckdb_je_edata_avail_remove(ph,phn);
    (base->mtx).field_0.field_0.locked.repr = false;
    pthread_mutex_unlock((pthread_mutex_t *)((long)&(base->mtx).field_0 + 0x48));
  }
  uVar1 = stack_size + 0x10;
  if (uVar1 < 0x1001) {
    size = duckdb_je_sz_index2size_tab[duckdb_je_sz_size2index_tab[stack_size + 0x17 >> 3]];
  }
  else if (uVar1 < 0x7000000000000001) {
    uVar4 = uVar1 * 2 - 1;
    lVar2 = 0x3f;
    if (uVar4 != 0) {
      for (; uVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    uVar4 = -1L << (0x3c - ((byte)lVar2 ^ 0x3f) & 0x3f);
    size = ~uVar4 + uVar1 & uVar4;
  }
  else {
    size = 0;
  }
  puVar3 = (undefined8 *)base_alloc_impl(tsdn,base,size,0x10,&esn,(size_t *)0x0);
  if (puVar3 == (undefined8 *)0x0) {
    duckdb_je_edata_avail_insert(ph,phn);
    return (void *)0x0;
  }
  phn->e_addr = puVar3;
  (phn->field_2).e_size_esn = size;
  phn->e_sn = esn;
  phn->e_bits = phn->e_bits & 0xfffffffff0000000 | 0xe81afff;
  *puVar3 = phn;
  return puVar3 + 2;
}

Assistant:

void *
b0_alloc_tcache_stack(tsdn_t *tsdn, size_t stack_size) {
	base_t *base = b0get();
	edata_t *edata = base_alloc_base_edata(tsdn, base);
	if (edata == NULL) {
		return NULL;
	}

	/*
	 * Reserve room for the header, which stores a pointer to the managing
	 * edata_t.  The header itself is located right before the return
	 * address, so that edata can be retrieved on dalloc.  Bump up to usize
	 * to improve reusability -- otherwise the freed stacks will be put back
	 * into the previous size class.
	 */
	size_t esn, alignment, header_size;
	b0_alloc_header_size(&header_size, &alignment);

	size_t alloc_size = sz_s2u(stack_size + header_size);
	void *addr = base_alloc_impl(tsdn, base, alloc_size, alignment, &esn,
	    NULL);
	if (addr == NULL) {
		edata_avail_insert(&base->edata_avail, edata);
		return NULL;
	}

	/* Set is_reused: see comments in base_edata_is_reused. */
	edata_binit(edata, addr, alloc_size, esn, true /* is_reused */);
	*(edata_t **)addr = edata;

	return (byte_t *)addr + header_size;
}